

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void dropColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  sqlite3_xauth p_Var1;
  int iVar2;
  i64 iVar3;
  uchar *zSql;
  i64 iVar4;
  RenameToken *pRVar5;
  RenameToken *pRVar6;
  char *pcVar7;
  uchar *puVar8;
  Parse sParse;
  
  db = context->pOut->db;
  iVar3 = sqlite3VdbeIntValue(*argv);
  zSql = sqlite3_value_text(argv[1]);
  iVar4 = sqlite3VdbeIntValue(argv[2]);
  pcVar7 = db->aDb[(int)iVar3].zDbSName;
  p_Var1 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  iVar2 = renameParseSql(&sParse,pcVar7,db,(char *)zSql,(uint)((int)iVar3 == 1));
  if (iVar2 == 0) {
    if ((sParse.pNewTable == (Table *)0x0) ||
       (iVar2 = (int)iVar4, (sParse.pNewTable)->nCol == 1 || (sParse.pNewTable)->nCol <= iVar2)) {
      iVar2 = sqlite3CorruptError(0x1b627);
    }
    else {
      pRVar5 = renameTokenFind(&sParse,(RenameCtx *)0x0,(sParse.pNewTable)->aCol[iVar2].zCnName);
      if (iVar2 < (sParse.pNewTable)->nCol + -1) {
        pRVar6 = renameTokenFind(&sParse,(RenameCtx *)0x0,
                                 (sParse.pNewTable)->aCol[(long)iVar2 + 1].zCnName);
        puVar8 = (uchar *)(pRVar6->t).z;
        pcVar7 = (pRVar5->t).z;
      }
      else {
        puVar8 = zSql + ((sParse.pNewTable)->u).tab.addColOffset;
        pcVar7 = (pRVar5->t).z;
        while ((*pcVar7 != '\0' && (*pcVar7 != ','))) {
          pcVar7 = pcVar7 + -1;
          (pRVar5->t).z = pcVar7;
        }
      }
      iVar2 = 0;
      pcVar7 = sqlite3MPrintf(db,"%.*s%s",(long)pcVar7 - (long)zSql,zSql,puVar8);
      sqlite3_result_text(context,pcVar7,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar7);
    }
  }
  renameParseCleanup(&sParse);
  db->xAuth = p_Var1;
  if (iVar2 != 0) {
    sqlite3_result_error_code(context,iVar2);
  }
  return;
}

Assistant:

static void dropColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  int iSchema = sqlite3_value_int(argv[0]);
  const char *zSql = (const char*)sqlite3_value_text(argv[1]);
  int iCol = sqlite3_value_int(argv[2]);
  const char *zDb = db->aDb[iSchema].zDbSName;
  int rc;
  Parse sParse;
  RenameToken *pCol;
  Table *pTab;
  const char *zEnd;
  char *zNew = 0;

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  rc = renameParseSql(&sParse, zDb, db, zSql, iSchema==1);
  if( rc!=SQLITE_OK ) goto drop_column_done;
  pTab = sParse.pNewTable;
  if( pTab==0 || pTab->nCol==1 || iCol>=pTab->nCol ){
    /* This can happen if the sqlite_schema table is corrupt */
    rc = SQLITE_CORRUPT_BKPT;
    goto drop_column_done;
  }

  pCol = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol].zCnName);
  if( iCol<pTab->nCol-1 ){
    RenameToken *pEnd;
    pEnd = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol+1].zCnName);
    zEnd = (const char*)pEnd->t.z;
  }else{
    assert( IsOrdinaryTable(pTab) );
    zEnd = (const char*)&zSql[pTab->u.tab.addColOffset];
    while( ALWAYS(pCol->t.z[0]!=0) && pCol->t.z[0]!=',' ) pCol->t.z--;
  }

  zNew = sqlite3MPrintf(db, "%.*s%s", pCol->t.z-zSql, zSql, zEnd);
  sqlite3_result_text(context, zNew, -1, SQLITE_TRANSIENT);
  sqlite3_free(zNew);

drop_column_done:
  renameParseCleanup(&sParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(context, rc);
  }
}